

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O1

void __thiscall bandit::reporter::xunit::it_starting(xunit *this,string *desc)

{
  int *piVar1;
  undefined1 *puVar2;
  ostream *poVar3;
  rep rVar4;
  string local_68;
  string local_48;
  
  piVar1 = &(this->super_progress_base).specs_run_;
  *piVar1 = *piVar1 + 1;
  puVar2 = &this->field_0x80;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)puVar2,"\t<testcase classname=\"",0x16);
  progress_base::current_context_name_abi_cxx11_(&local_48,&this->super_progress_base);
  escape(&local_68,this,&local_48);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar2,"name=\"",6);
  escape(&local_68,this,desc);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  rVar4 = std::chrono::_V2::system_clock::now();
  (this->testcase_start_time_point_).__d.__r = rVar4;
  return;
}

Assistant:

void it_starting(const std::string& desc) override {
        progress_base::it_starting(desc);
        work_stm_ << "\t<testcase classname=\"" << escape(current_context_name()) << "\" ";
        work_stm_ << "name=\"" << escape(desc) << "\"";
        testcase_start_time_point_ = std::chrono::high_resolution_clock::now();
      }